

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O0

Properties * __thiscall QFontEngine::properties(QFontEngine *this)

{
  int iVar1;
  long *in_RSI;
  Properties *in_RDI;
  long in_FS_OFFSET;
  qreal qVar2;
  qreal awidth;
  qreal aheight;
  Properties *p;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>,_QByteArray>
  *in_stack_fffffffffffffdf8;
  Properties *this_00;
  QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>
  *in_stack_fffffffffffffe08;
  QByteArray *in_stack_fffffffffffffe10;
  QFixed local_1bc;
  int local_1b8;
  QFixed local_1b4;
  QRectF local_1b0;
  int local_18c;
  int local_188;
  int local_184;
  undefined1 local_180 [31];
  undefined1 local_161;
  undefined1 local_160 [31];
  undefined1 local_141;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  memcpy(in_RDI,&DAT_00bcc760,0x70);
  Properties::Properties(this_00);
  QList<QString>::first((QList<QString> *)this_00);
  QString::toUtf8((QString *)in_stack_fffffffffffffdf8);
  convertToPostscriptFontFamilyName(in_stack_fffffffffffffe10);
  local_141 = 0x2d;
  ::operator+((QByteArray *)in_stack_fffffffffffffe08,(char *)this_00);
  QByteArray::number((uint)local_160,(uint)((ulong)in_RSI[0xe] >> 0x1c) & 3);
  ::operator+((QStringBuilder<QByteArray,_char> *)in_stack_fffffffffffffe08,&this_00->postscriptName
             );
  local_161 = 0x2d;
  ::operator+(&in_stack_fffffffffffffe08->a,(char *)this_00);
  QByteArray::number((uint)local_180,(uint)((ulong)in_RSI[0xe] >> 0x28) & 0x3ff);
  ::operator+(in_stack_fffffffffffffe08,&this_00->postscriptName);
  ::QStringBuilder::operator_cast_to_QByteArray(in_stack_fffffffffffffdf8);
  QByteArray::operator=(&this_00->postscriptName,(QByteArray *)in_stack_fffffffffffffdf8);
  QByteArray::~QByteArray((QByteArray *)0x760b44);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>,_QByteArray>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>,_QByteArray>
                     *)this_00);
  QByteArray::~QByteArray((QByteArray *)0x760b5e);
  QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>::
  ~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>
                   *)0x760b6b);
  QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray> *)this_00);
  QByteArray::~QByteArray((QByteArray *)0x760b85);
  QStringBuilder<QByteArray,_char>::~QStringBuilder((QStringBuilder<QByteArray,_char> *)0x760b92);
  QByteArray::~QByteArray((QByteArray *)0x760b9f);
  QByteArray::~QByteArray((QByteArray *)0x760bac);
  local_184 = (**(code **)(*in_RSI + 0xf0))();
  (in_RDI->ascent).val = local_184;
  local_188 = (**(code **)(*in_RSI + 0x100))();
  (in_RDI->descent).val = local_188;
  local_18c = (**(code **)(*in_RSI + 0x108))();
  (in_RDI->leading).val = local_18c;
  (in_RDI->emSquare).val = (in_RDI->ascent).val;
  qVar2 = QFixed::toReal(&in_RDI->ascent);
  qVar2 = -qVar2;
  awidth = (qreal)(**(code **)(*in_RSI + 0x130))();
  local_1b8 = (in_RDI->descent).val;
  local_1b4 = QFixed::operator+((QFixed *)in_stack_fffffffffffffdf8,(int)this_00);
  aheight = QFixed::toReal(&local_1b4);
  QRectF::QRectF(&local_1b0,0.0,qVar2,awidth,aheight);
  (in_RDI->boundingBox).xp = local_1b0.xp;
  (in_RDI->boundingBox).yp = local_1b0.yp;
  (in_RDI->boundingBox).w = local_1b0.w;
  (in_RDI->boundingBox).h = local_1b0.h;
  QFixed::QFixed(&local_1bc,0);
  (in_RDI->italicAngle).val = local_1bc.val;
  (in_RDI->capHeight).val = (in_RDI->ascent).val;
  iVar1 = (**(code **)(*in_RSI + 0x120))();
  (in_RDI->lineWidth).val = iVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QFontEngine::Properties QFontEngine::properties() const
{
    Properties p;
    p.postscriptName =
            QFontEngine::convertToPostscriptFontFamilyName(fontDef.families.first().toUtf8()) + '-'
            + QByteArray::number(fontDef.style) + '-' + QByteArray::number(fontDef.weight);
    p.ascent = ascent();
    p.descent = descent();
    p.leading = leading();
    p.emSquare = p.ascent;
    p.boundingBox = QRectF(0, -p.ascent.toReal(), maxCharWidth(), (p.ascent + p.descent).toReal());
    p.italicAngle = 0;
    p.capHeight = p.ascent;
    p.lineWidth = lineThickness();
    return p;
}